

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O3

WebPInfoStatus
ParseLosslessTransform(WebPInfo *webp_info,uint8_t *data,size_t data_size,uint64_t *bit_pos)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  uint64_t uVar4;
  uint uVar5;
  WebPInfoStatus WVar6;
  char *pcVar7;
  
  uVar2 = *bit_pos;
  *bit_pos = uVar2 + 1;
  if (uVar2 >> 3 < data_size) {
    bVar1 = data[uVar2 >> 3];
    uVar5 = (uint)uVar2 & 7;
    pcVar7 = "Yes";
    if ((bVar1 >> uVar5 & 1) == 0) {
      pcVar7 = "No";
    }
    WVar6 = WEBP_INFO_OK;
    printf("  Use transform:    %s\n",pcVar7);
    if ((bVar1 >> uVar5 & 1) != 0) {
      uVar5 = 0;
      iVar3 = 0;
      uVar4 = *bit_pos;
      do {
        *bit_pos = uVar4 + 1;
        if (data_size <= uVar4 >> 3) {
          if (webp_info->show_diagnosis_ == 0) {
            return WEBP_INFO_TRUNCATED_DATA;
          }
          ParseLosslessTransform_cold_2();
          return WEBP_INFO_TRUNCATED_DATA;
        }
        uVar5 = uVar5 | (uint)((data[uVar4 >> 3] >> ((uint)uVar4 & 7) & 1) != 0) <<
                        ((byte)iVar3 & 0x1f);
        iVar3 = iVar3 + 1;
        uVar4 = uVar4 + 1;
      } while (iVar3 != 2);
      printf("  1st transform:    %s (%d)\n",
             kLosslessTransforms_rel + *(int *)(kLosslessTransforms_rel + (long)(int)uVar5 * 4),
             (ulong)uVar5);
      if (uVar5 < 2) {
        uVar5 = 0;
        iVar3 = 0;
        uVar4 = *bit_pos;
        do {
          *bit_pos = uVar4 + 1;
          if (data_size <= uVar4 >> 3) {
            if (webp_info->show_diagnosis_ == 0) {
              return WEBP_INFO_TRUNCATED_DATA;
            }
            ParseLosslessTransform_cold_4();
            return WEBP_INFO_TRUNCATED_DATA;
          }
          uVar5 = uVar5 | (uint)((data[uVar4 >> 3] >> ((uint)uVar4 & 7) & 1) != 0) <<
                          ((byte)iVar3 & 0x1f);
          iVar3 = iVar3 + 1;
          uVar4 = uVar4 + 1;
        } while (iVar3 != 3);
        uVar5 = 1 << ((char)uVar5 + 2U & 0x1f);
        pcVar7 = "  Tran. block size: %d\n";
      }
      else {
        if (uVar5 != 3) {
          return WEBP_INFO_OK;
        }
        uVar5 = 0;
        iVar3 = 0;
        uVar4 = *bit_pos;
        do {
          *bit_pos = uVar4 + 1;
          if (data_size <= uVar4 >> 3) {
            if (webp_info->show_diagnosis_ == 0) {
              return WEBP_INFO_TRUNCATED_DATA;
            }
            ParseLosslessTransform_cold_3();
            return WEBP_INFO_TRUNCATED_DATA;
          }
          uVar5 = uVar5 | (uint)((data[uVar4 >> 3] >> ((uint)uVar4 & 7) & 1) != 0) <<
                          ((byte)iVar3 & 0x1f);
          iVar3 = iVar3 + 1;
          uVar4 = uVar4 + 1;
        } while (iVar3 != 8);
        uVar5 = uVar5 + 1;
        pcVar7 = "  No. of colors:    %d\n";
      }
      WVar6 = WEBP_INFO_OK;
      printf(pcVar7,(ulong)uVar5);
    }
  }
  else {
    WVar6 = WEBP_INFO_TRUNCATED_DATA;
    if (webp_info->show_diagnosis_ != 0) {
      ParseLosslessTransform_cold_1();
    }
  }
  return WVar6;
}

Assistant:

static WebPInfoStatus ParseLosslessTransform(WebPInfo* const webp_info,
                                             const uint8_t* const data,
                                             size_t data_size,
                                             uint64_t* const  bit_pos) {
  int use_transform, block_size, n_colors;
  LL_GET_BITS(use_transform, 1);
  printf("  Use transform:    %s\n", use_transform ? "Yes" : "No");
  if (use_transform) {
    int type;
    LL_GET_BITS(type, 2);
    printf("  1st transform:    %s (%d)\n", kLosslessTransforms[type], type);
    switch (type) {
      case PREDICTOR_TRANSFORM:
      case CROSS_COLOR_TRANSFORM:
        LL_GET_BITS(block_size, 3);
        block_size = 1 << (block_size + 2);
        printf("  Tran. block size: %d\n", block_size);
        break;
      case COLOR_INDEXING_TRANSFORM:
        LL_GET_BITS(n_colors, 8);
        n_colors += 1;
        printf("  No. of colors:    %d\n", n_colors);
        break;
      default: break;
    }
  }
  return WEBP_INFO_OK;
}